

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

bool operator!=(Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
                *lhs,Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
                     *rhs)

{
  int *piVar1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  sVar3 = lhs->index_;
  sVar4 = rhs->index_;
  bVar11 = true;
  if (lhs->state_[(uint)((int)(sVar3 + 0x56f) + (int)((sVar3 + 0x56f) / 0x56f) * -0x56f)] ==
      rhs->state_[(uint)((int)(sVar4 + 0x56f) + (int)((sVar4 + 0x56f) / 0x56f) * -0x56f)]) {
    uVar8 = sVar4 + 0x570;
    lVar7 = (long)&lhs->index_ + sVar3 * 4;
    uVar5 = sVar3 + 0x570;
    lVar10 = 0x56e;
    lVar9 = (long)&rhs->index_ + sVar4 * 4;
    do {
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
      if (!bVar11) {
        return bVar11;
      }
      uVar6 = uVar8 / 0x56f;
      piVar1 = (int *)(lVar7 + (uVar5 / 0x56f) * -0x15bc);
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 4;
      uVar5 = uVar5 + 1;
      piVar2 = (int *)(lVar9 + uVar6 * -0x15bc);
      lVar9 = lVar9 + 4;
    } while (*piVar1 == *piVar2);
  }
  return bVar11;
}

Assistant:

bool operator!=(const Well& lhs, const Well& rhs)
    {
        return !(lhs == rhs);
    }